

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::anon_unknown_8::LogFileObject::LogFileObject
          (LogFileObject *this,LogSeverity severity,char *base_filename)

{
  char *__s;
  rep rVar1;
  char *local_50;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  char *local_20;
  char *base_filename_local;
  LogFileObject *pLStack_10;
  LogSeverity severity_local;
  LogFileObject *this_local;
  
  local_20 = base_filename;
  base_filename_local._4_4_ = severity;
  pLStack_10 = this;
  google::base::Logger::Logger(&this->super_Logger);
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__LogFileObject_001707c0;
  std::mutex::mutex(&this->mutex_);
  this->base_filename_selected_ = local_20 != (char *)0x0;
  if (local_20 == (char *)0x0) {
    local_50 = "";
  }
  else {
    local_50 = local_20;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->base_filename_,local_50,&local_21);
  std::allocator<char>::~allocator(&local_21);
  __s = glog_internal_namespace_::ProgramInvocationShortName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->symlink_basename_,__s,local_35);
  std::allocator<char>::~allocator(local_35);
  std::__cxx11::string::string((string *)&this->filename_extension_);
  std::unique_ptr<_IO_FILE,std::default_delete<_IO_FILE>>::
  unique_ptr<std::default_delete<_IO_FILE>,void>
            ((unique_ptr<_IO_FILE,std::default_delete<_IO_FILE>> *)&this->file_);
  this->severity_ = base_filename_local._4_4_;
  this->bytes_since_flush_ = 0;
  this->dropped_mem_length_ = 0;
  this->file_length_ = 0;
  this->rollover_attempt_ = 0x1f;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->next_flush_time_);
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->start_time_).__d.__r = rVar1;
  return;
}

Assistant:

LogFileObject::LogFileObject(LogSeverity severity, const char* base_filename)
    : base_filename_selected_(base_filename != nullptr),
      base_filename_((base_filename != nullptr) ? base_filename : ""),
      symlink_basename_(glog_internal_namespace_::ProgramInvocationShortName()),
      filename_extension_(),
      severity_(severity),
      rollover_attempt_(kRolloverAttemptFrequency - 1),
      start_time_(std::chrono::system_clock::now()) {}